

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadPrimTriStrips
          (ColladaParser *this,size_t numOffsets,size_t perVertexOffset,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t currentPrimitive,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *indices)

{
  ulong currentVertex;
  
  currentVertex = (ulong)((uint)currentPrimitive & 1);
  CopyVertex(this,currentVertex,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,
             currentPrimitive,indices);
  CopyVertex(this,currentVertex ^ 1,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,
             currentPrimitive,indices);
  CopyVertex(this,2,numOffsets,1,perVertexOffset,pMesh,pPerIndexChannels,currentPrimitive,indices);
  return;
}

Assistant:

void ColladaParser::ReadPrimTriStrips(size_t numOffsets, size_t perVertexOffset, Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels, size_t currentPrimitive, const std::vector<size_t>& indices) {
    if (currentPrimitive % 2 != 0) {
        //odd tristrip triangles need their indices mangled, to preserve winding direction
        CopyVertex(1, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(0, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(2, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
    }
    else {//for non tristrips or even tristrip triangles
        CopyVertex(0, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(1, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
        CopyVertex(2, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
    }
}